

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall
t_java_generator::generate_process_function
          (t_java_generator *this,t_service *tservice,t_function *tfunction)

{
  string *__lhs;
  ofstream_with_content_based_conditional_update *os;
  int *piVar1;
  t_struct *ptVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  ostream *poVar6;
  pointer pptVar7;
  char *pcVar8;
  char *pcVar9;
  string resultname;
  string argsname;
  allocator local_11a;
  allocator local_119;
  string local_118;
  t_struct *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  __lhs = &tfunction->name_;
  std::operator+(&local_d0,__lhs,"_args");
  std::operator+(&local_f0,__lhs,"_result");
  if (tfunction->oneway_ == true) {
    std::__cxx11::string::assign((char *)&local_f0);
  }
  os = &this->f_service_;
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::operator<<(poVar6,"public static class ");
  poVar6 = std::operator<<(poVar6,(string *)__lhs);
  poVar6 = std::operator<<(poVar6,"<I extends Iface> extends org.apache.thrift.ProcessFunction<I, ")
  ;
  poVar6 = std::operator<<(poVar6,(string *)&local_d0);
  poVar6 = std::operator<<(poVar6,"> {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::operator<<(poVar6,"public ");
  poVar6 = std::operator<<(poVar6,(string *)__lhs);
  poVar6 = std::operator<<(poVar6,"() {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::operator<<(poVar6,"  super(\"");
  poVar6 = std::operator<<(poVar6,(string *)__lhs);
  poVar6 = std::operator<<(poVar6,"\");");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::operator<<(poVar6,"}");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::operator<<(poVar6,"public ");
  poVar6 = std::operator<<(poVar6,(string *)&local_d0);
  poVar6 = std::operator<<(poVar6," getEmptyArgsInstance() {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::operator<<(poVar6,"  return new ");
  poVar6 = std::operator<<(poVar6,(string *)&local_d0);
  poVar6 = std::operator<<(poVar6,"();");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::operator<<(poVar6,"}");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::operator<<(poVar6,"protected boolean isOneway() {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::operator<<(poVar6,"  return ");
  pcVar9 = "false";
  pcVar8 = "false";
  if (tfunction->oneway_ != false) {
    pcVar8 = "true";
  }
  poVar6 = std::operator<<(poVar6,pcVar8);
  poVar6 = std::operator<<(poVar6,";");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::operator<<(poVar6,"}");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::operator<<(poVar6,"@Override");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::operator<<(poVar6,"protected boolean rethrowUnhandledExceptions() {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::operator<<(poVar6,"  return ");
  if (this->rethrow_unhandled_exceptions_ != false) {
    pcVar9 = "true";
  }
  poVar6 = std::operator<<(poVar6,pcVar9);
  poVar6 = std::operator<<(poVar6,";");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::operator<<(poVar6,"}");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::operator<<(poVar6,"public ");
  poVar6 = std::operator<<(poVar6,(string *)&local_f0);
  poVar6 = std::operator<<(poVar6," getResult(I iface, ");
  poVar6 = std::operator<<(poVar6,(string *)&local_d0);
  poVar6 = std::operator<<(poVar6," args) throws org.apache.thrift.TException {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  if (tfunction->oneway_ == false) {
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar6 = std::operator<<(poVar6,(string *)&local_f0);
    poVar6 = std::operator<<(poVar6," result = new ");
    poVar6 = std::operator<<(poVar6,(string *)&local_f0);
    poVar6 = std::operator<<(poVar6,"();");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  }
  local_f8 = tfunction->xceptions_;
  if ((local_f8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (local_f8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)os,(string *)&local_118);
    poVar6 = std::operator<<(poVar6,"try {");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_118);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
  }
  ptVar2 = tfunction->arglist_;
  t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
  std::operator<<((ostream *)os,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  if (tfunction->oneway_ == false) {
    iVar5 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar5 == '\0') {
      std::operator<<((ostream *)os,"result.success = ");
    }
  }
  poVar6 = std::operator<<((ostream *)os,"iface.");
  std::__cxx11::string::string((string *)&local_50,(string *)__lhs);
  get_rpc_method_name(&local_118,this,&local_50);
  poVar6 = std::operator<<(poVar6,(string *)&local_118);
  std::operator<<(poVar6,"(");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_50);
  bVar3 = true;
  for (pptVar7 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar7 !=
      (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
    if (!bVar3) {
      std::operator<<((ostream *)os,", ");
    }
    poVar6 = std::operator<<((ostream *)os,"args.");
    std::operator<<(poVar6,(string *)&(*pptVar7)->name_);
    bVar3 = false;
  }
  poVar6 = std::operator<<((ostream *)os,");");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  if (tfunction->oneway_ == false) {
    iVar5 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar5 == '\0') {
      bVar3 = type_can_be_null(this,tfunction->returntype_);
      if (!bVar3) {
        poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
        poVar6 = std::operator<<(poVar6,"result.set");
        std::__cxx11::string::string((string *)&local_70,"success",&local_119);
        get_cap_name(&local_118,this,&local_70);
        poVar6 = std::operator<<(poVar6,(string *)&local_118);
        std::__cxx11::string::string((string *)&local_b0,"isSet",&local_11a);
        get_cap_name(&local_90,this,&local_b0);
        poVar6 = std::operator<<(poVar6,(string *)&local_90);
        poVar6 = std::operator<<(poVar6,"(true);");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
  }
  bVar4 = tfunction->oneway_;
  if (((bool)bVar4 == false) &&
     ((local_f8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (local_f8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)os,(string *)&local_118);
    std::operator<<(poVar6,"}");
    std::__cxx11::string::~string((string *)&local_118);
    for (pptVar7 = (local_f8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar7 !=
        (local_f8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
      poVar6 = std::operator<<((ostream *)os," catch (");
      type_name_abi_cxx11_(&local_118,this,(*pptVar7)->type_,false,false,false,false);
      poVar6 = std::operator<<(poVar6,(string *)&local_118);
      poVar6 = std::operator<<(poVar6," ");
      poVar6 = std::operator<<(poVar6,(string *)&(*pptVar7)->name_);
      poVar6 = std::operator<<(poVar6,") {");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_118);
      if (tfunction->oneway_ == false) {
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
        poVar6 = std::operator<<((ostream *)os,(string *)&local_118);
        poVar6 = std::operator<<(poVar6,"result.");
        poVar6 = std::operator<<(poVar6,(string *)&(*pptVar7)->name_);
        poVar6 = std::operator<<(poVar6," = ");
        poVar6 = std::operator<<(poVar6,(string *)&(*pptVar7)->name_);
        poVar6 = std::operator<<(poVar6,";");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_118);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
        poVar6 = std::operator<<((ostream *)os,(string *)&local_118);
        std::operator<<(poVar6,"}");
        std::__cxx11::string::~string((string *)&local_118);
      }
      else {
        std::operator<<((ostream *)os,"}");
      }
    }
    std::operator<<((ostream *)os,(string *)&::endl_abi_cxx11_);
    bVar4 = tfunction->oneway_;
  }
  if ((bVar4 & 1) == 0) {
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
    pcVar8 = "return result;";
  }
  else {
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
    pcVar8 = "return null;";
  }
  poVar6 = std::operator<<(poVar6,pcVar8);
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::operator<<(poVar6,"}");
  std::operator<<((ostream *)os,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
  poVar6 = std::operator<<((ostream *)os,(string *)&local_118);
  poVar6 = std::operator<<(poVar6,"}");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  return;
}

Assistant:

void t_java_generator::generate_process_function(t_service* tservice, t_function* tfunction) {
  string argsname = tfunction->get_name() + "_args";
  string resultname = tfunction->get_name() + "_result";
  if (tfunction->is_oneway()) {
    resultname = "org.apache.thrift.TBase";
  }

  (void)tservice;
  // Open class
  indent(f_service_) << "public static class " << tfunction->get_name()
                     << "<I extends Iface> extends org.apache.thrift.ProcessFunction<I, "
                     << argsname << "> {" << endl;
  indent_up();

  indent(f_service_) << "public " << tfunction->get_name() << "() {" << endl;
  indent(f_service_) << "  super(\"" << tfunction->get_name() << "\");" << endl;
  indent(f_service_) << "}" << endl << endl;

  indent(f_service_) << "public " << argsname << " getEmptyArgsInstance() {" << endl;
  indent(f_service_) << "  return new " << argsname << "();" << endl;
  indent(f_service_) << "}" << endl << endl;

  indent(f_service_) << "protected boolean isOneway() {" << endl;
  indent(f_service_) << "  return " << ((tfunction->is_oneway()) ? "true" : "false") << ";" << endl;
  indent(f_service_) << "}" << endl << endl;

  indent(f_service_) << "@Override" << endl;
  indent(f_service_) << "protected boolean rethrowUnhandledExceptions() {" << endl;
  indent(f_service_) << "  return " << ((rethrow_unhandled_exceptions_) ? "true" : "false") << ";" << endl;
  indent(f_service_) << "}" << endl << endl;

  indent(f_service_) << "public " << resultname << " getResult(I iface, " << argsname
                     << " args) throws org.apache.thrift.TException {" << endl;
  indent_up();
  if (!tfunction->is_oneway()) {
    indent(f_service_) << resultname << " result = new " << resultname << "();" << endl;
  }

  t_struct* xs = tfunction->get_xceptions();
  const std::vector<t_field*>& xceptions = xs->get_members();
  vector<t_field*>::const_iterator x_iter;

  // Try block for a function with exceptions
  if (xceptions.size() > 0) {
    f_service_ << indent() << "try {" << endl;
    indent_up();
  }

  // Generate the function call
  t_struct* arg_struct = tfunction->get_arglist();
  const std::vector<t_field*>& fields = arg_struct->get_members();
  vector<t_field*>::const_iterator f_iter;
  f_service_ << indent();

  if (!tfunction->is_oneway() && !tfunction->get_returntype()->is_void()) {
    f_service_ << "result.success = ";
  }
  f_service_ << "iface." << get_rpc_method_name(tfunction->get_name()) << "(";
  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
    } else {
      f_service_ << ", ";
    }
    f_service_ << "args." << (*f_iter)->get_name();
  }
  f_service_ << ");" << endl;

  // Set isset on success field
  if (!tfunction->is_oneway() && !tfunction->get_returntype()->is_void()
      && !type_can_be_null(tfunction->get_returntype())) {
    indent(f_service_) << "result.set" << get_cap_name("success") << get_cap_name("isSet")
                       << "(true);" << endl;
  }

  if (!tfunction->is_oneway() && xceptions.size() > 0) {
    indent_down();
    f_service_ << indent() << "}";
    for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
      f_service_ << " catch (" << type_name((*x_iter)->get_type(), false, false) << " "
                 << (*x_iter)->get_name() << ") {" << endl;
      if (!tfunction->is_oneway()) {
        indent_up();
        f_service_ << indent() << "result." << (*x_iter)->get_name() << " = "
                   << (*x_iter)->get_name() << ";" << endl;
        indent_down();
        f_service_ << indent() << "}";
      } else {
        f_service_ << "}";
      }
    }
    f_service_ << endl;
  }

  if (tfunction->is_oneway()) {
    indent(f_service_) << "return null;" << endl;
  } else {
    indent(f_service_) << "return result;" << endl;
  }
  indent_down();
  indent(f_service_) << "}";

  // Close function
  f_service_ << endl;

  // Close class
  indent_down();
  f_service_ << indent() << "}" << endl << endl;
}